

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

int Wlc_NtkRemapLevels(Wlc_Ntk_t *p,Vec_Int_t *vObjs,int nLevels)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  Wlc_Obj_t *pWVar6;
  void *__s;
  void *__s_00;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  uVar3 = nLevels + 1;
  uVar9 = 0x10;
  if (0xe < (uint)nLevels) {
    uVar9 = uVar3;
  }
  if (uVar9 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar9 * 4);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)(int)uVar3 * 4);
  }
  if (uVar9 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    __s_00 = malloc((long)(int)uVar9 << 2);
  }
  if (__s_00 != (void *)0x0) {
    memset(__s_00,0,(long)(int)uVar3 << 2);
  }
  if (nLevels < 0) {
LAB_0034405a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *(undefined4 *)((long)__s_00 + (ulong)(uint)nLevels * 4) = 1;
  iVar8 = vObjs->nSize;
  if (0 < (long)iVar8) {
    piVar4 = vObjs->pArray;
    lVar11 = 0;
    do {
      iVar2 = piVar4[lVar11];
      lVar12 = (long)iVar2;
      if ((lVar12 < 0) || ((p->vLevels).nSize <= iVar2)) goto LAB_0034401c;
      piVar5 = (p->vLevels).pArray;
      uVar9 = piVar5[lVar12];
      if ((uint)nLevels < uVar9) goto LAB_0034405a;
      *(undefined4 *)((long)__s_00 + (ulong)uVar9 * 4) = 1;
      if ((iVar2 == 0) || (p->nObjsAlloc <= iVar2)) {
LAB_0034403b:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar6 = p->pObjs;
      pWVar1 = pWVar6 + lVar12;
      lVar13 = 0;
      while (lVar13 < (int)pWVar1->nFanins) {
        if ((2 < pWVar1->nFanins) ||
           (paVar10 = &pWVar6[lVar12].field_10,
           (undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) ==
           (undefined1  [24])0x6)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
        }
        uVar9 = paVar10->Fanins[lVar13];
        if ((ulong)uVar9 != 0) {
          if (((int)uVar9 < 0) || ((p->vLevels).nSize <= (int)uVar9)) goto LAB_0034401c;
          uVar9 = piVar5[uVar9];
          if ((uint)nLevels < uVar9) goto LAB_0034405a;
          *(undefined4 *)((long)__s_00 + (ulong)uVar9 * 4) = 1;
        }
        lVar13 = lVar13 + 1;
        if (iVar2 == 0) goto LAB_0034403b;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar8);
  }
  uVar7 = 0;
  iVar8 = 0;
  do {
    if (*(int *)((long)__s_00 + uVar7 * 4) != 0) {
      *(int *)((long)__s + uVar7 * 4) = iVar8;
      iVar8 = iVar8 + 1;
    }
    uVar7 = uVar7 + 1;
  } while (uVar3 != uVar7);
  if (0 < (p->vLevels).nSize) {
    piVar4 = (p->vLevels).pArray;
    lVar11 = 0;
    do {
      uVar3 = piVar4[lVar11];
      if ((uint)nLevels < uVar3) {
LAB_0034401c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (*(int *)((long)__s_00 + (ulong)uVar3 * 4) == 0) {
        iVar8 = -1;
      }
      else {
        iVar8 = *(int *)((long)__s + (ulong)uVar3 * 4);
      }
      piVar4[lVar11] = iVar8;
      lVar11 = lVar11 + 1;
    } while (lVar11 < (p->vLevels).nSize);
  }
  iVar8 = *(int *)((long)__s + (ulong)(uint)nLevels * 4);
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return iVar8;
}

Assistant:

int Wlc_NtkRemapLevels( Wlc_Ntk_t * p, Vec_Int_t * vObjs, int nLevels )
{
    int i, k, iFanin, iObj, Entry, Level = 0, Res = nLevels;
    Vec_Int_t * vMap  = Vec_IntStart( nLevels+1 );
    Vec_Int_t * vUsed = Vec_IntStart( nLevels+1 );
    // mark used levels
    Vec_IntWriteEntry( vUsed, nLevels, 1 );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        Vec_IntWriteEntry( vUsed, Wlc_ObjLevelId(p, iObj), 1 );
        Wlc_ObjForEachFanin( Wlc_NtkObj(p, iObj), iFanin, k ) if ( iFanin )
            Vec_IntWriteEntry( vUsed, Wlc_ObjLevelId(p, iFanin), 1 );
    }
    // create level map
    Vec_IntForEachEntry( vUsed, Entry, i )
        if ( Entry )
            Vec_IntWriteEntry( vMap, i, Level++ );
    //printf( "Total used levels %d -> %d\n", nLevels, Level );
    // remap levels
    Vec_IntForEachEntry( &p->vLevels, Level, i )
    {
        if ( Vec_IntEntry(vUsed, Level) )
            Vec_IntWriteEntry( &p->vLevels, i, Vec_IntEntry(vMap, Level) );
        else
            Vec_IntWriteEntry( &p->vLevels, i, -1 );
    }
    Res = Vec_IntEntry( vMap, nLevels );
    Vec_IntFree( vUsed );
    Vec_IntFree( vMap );
    return Res;
}